

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.cpp
# Opt level: O3

void __thiscall embree::LineSegments::LineSegments(LineSegments *this,Device *device,GType gtype)

{
  bool *pbVar1;
  undefined8 *puVar2;
  Device *pDVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Buffer *pBVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  
  Geometry::Geometry(&this->super_Geometry,device,gtype,0,1);
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__LineSegments_02188ff0;
  *(undefined8 *)&(this->super_Geometry).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x68 = 0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(undefined8 *)&this->field_0x78 = 0x100000000;
  this->field_0x80 = 1;
  *(undefined8 *)&this->field_0x84 = 0;
  *(undefined8 *)&this->field_0x8c = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.num + 4) = 0;
  (this->vertices0).super_RawBufferView.modCounter = 1;
  (this->vertices0).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->vertices0).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.num + 4) = 0;
  (this->normals0).super_RawBufferView.modCounter = 1;
  (this->normals0).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->normals0).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->flags).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->flags).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->flags).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->flags).super_RawBufferView.num + 4) = 0;
  (this->flags).super_RawBufferView.modCounter = 1;
  (this->flags).super_RawBufferView.modified = true;
  (this->flags).super_RawBufferView.userData = 0;
  (this->flags).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  pDVar3 = (this->super_Geometry).device;
  (this->vertices).alloc.device = pDVar3;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fx> *)0x0;
  (this->normals).alloc.device = pDVar3;
  (this->normals).size_active = 0;
  (this->normals).size_alloced = 0;
  (this->normals).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->vertexAttribs).alloc.device = pDVar3;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  (this->vertexAttribs).items = (BufferView<char> *)0x0;
  this->tessellationRate = 4;
  this->maxRadiusScale = 1.0;
  uVar16 = (ulong)(this->super_Geometry).numTimeSteps;
  if (uVar16 == 0) {
    (this->vertices).size_active = 0;
  }
  else {
    iVar10 = (*(pDVar3->super_State).super_RefCount._vptr_RefCount[8])(pDVar3,uVar16 * 0x38,8);
    (this->vertices).items = (BufferView<embree::Vec3fx> *)CONCAT44(extraout_var,iVar10);
    if ((this->vertices).size_active == 0) {
      uVar15 = 0;
    }
    else {
      puVar11 = (undefined8 *)&DAT_00000030;
      uVar13 = 0;
      do {
        pBVar4 = (this->vertices).items;
        uVar5 = puVar11[-6];
        uVar6 = puVar11[-5];
        uVar7 = puVar11[-4];
        uVar8 = puVar11[-3];
        pBVar9 = (Buffer *)puVar11[-1];
        pbVar1 = &pBVar4[-1].super_RawBufferView.modified + (long)puVar11;
        *(undefined8 *)pbVar1 = puVar11[-2];
        ((Ref<embree::Buffer> *)(pbVar1 + 8))->ptr = pBVar9;
        puVar2 = (undefined8 *)((long)&pBVar4[-1].super_RawBufferView.num + (long)puVar11);
        *puVar2 = uVar7;
        puVar2[1] = uVar8;
        puVar2 = (undefined8 *)((long)&pBVar4[-1].super_RawBufferView.dptr_ofs + (long)puVar11);
        *puVar2 = uVar5;
        puVar2[1] = uVar6;
        *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + (long)puVar11) = *puVar11;
        *puVar11 = 0;
        uVar13 = uVar13 + 1;
        uVar15 = (this->vertices).size_active;
        puVar11 = puVar11 + 7;
      } while (uVar13 < uVar15);
    }
    lVar12 = uVar16 - uVar15;
    if (uVar15 <= uVar16 && lVar12 != 0) {
      lVar14 = uVar15 * 0x38 + 0x30;
      do {
        pBVar4 = (this->vertices).items;
        puVar11 = (undefined8 *)((long)pBVar4 + lVar14 + -0x20);
        *puVar11 = 0;
        puVar11[1] = 0;
        puVar11 = (undefined8 *)((long)pBVar4 + lVar14 + -0x30);
        *puVar11 = 0;
        puVar11[1] = 0;
        *(undefined8 *)((long)pBVar4 + lVar14 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar4 + lVar14 + -8) = 1;
        *(undefined4 *)((long)pBVar4 + lVar14 + -4) = 0;
        *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar14) = 0;
        lVar14 = lVar14 + 0x38;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    pDVar3 = (this->vertices).alloc.device;
    if (pDVar3 != (Device *)0x0) {
      (*(pDVar3->super_State).super_RefCount._vptr_RefCount[9])(pDVar3,0);
    }
    (this->vertices).size_active = uVar16;
    (this->vertices).size_alloced = uVar16;
  }
  return;
}

Assistant:

LineSegments::LineSegments (Device* device, Geometry::GType gtype)
    : Geometry(device,gtype,0,1), tessellationRate(4)
  {
    vertices.resize(numTimeSteps);
  }